

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

QList<QRect> * __thiscall QList<QRect>::fill(QList<QRect> *this,parameter_type t,qsizetype newSize)

{
  qsizetype *pqVar1;
  undefined8 *puVar2;
  Data *pDVar3;
  QArrayData *pQVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  QRect *pQVar10;
  QRect *pQVar11;
  long lVar12;
  long lVar13;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar3 = (this->d).d;
  lVar13 = newSize;
  if (pDVar3 != (Data *)0x0) {
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar3 == (Data *)0x0) {
        lVar12 = 0;
      }
      else {
        lVar12 = (pDVar3->super_QArrayData).alloc;
      }
      if (newSize <= lVar12) {
        iVar5 = (t->x1).m_i;
        iVar6 = (t->y1).m_i;
        iVar7 = (t->x2).m_i;
        iVar8 = (t->y2).m_i;
        lVar13 = (this->d).size;
        if (newSize <= lVar13) {
          lVar13 = newSize;
        }
        if (lVar13 != 0) {
          pQVar11 = (this->d).ptr;
          lVar12 = 0;
          do {
            uVar9 = *(undefined8 *)&t->x2;
            puVar2 = (undefined8 *)((long)&(pQVar11->x1).m_i + lVar12);
            *puVar2 = *(undefined8 *)t;
            puVar2[1] = uVar9;
            lVar12 = lVar12 + 0x10;
          } while (lVar13 * 0x10 != lVar12);
        }
        lVar13 = (this->d).size;
        if (lVar13 < newSize) {
          if (newSize != lVar13) {
            pQVar11 = (this->d).ptr;
            lVar13 = lVar13 - newSize;
            do {
              pQVar10 = pQVar11 + (this->d).size;
              (pQVar10->x1).m_i = iVar5;
              (pQVar10->y1).m_i = iVar6;
              (pQVar10->x2).m_i = iVar7;
              (pQVar10->y2).m_i = iVar8;
              pqVar1 = &(this->d).size;
              *pqVar1 = *pqVar1 + 1;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 0);
          }
        }
        else if (newSize < lVar13) {
          (this->d).size = newSize;
        }
        goto LAB_004682ab;
      }
    }
    if (pDVar3 != (Data *)0x0) {
      lVar13 = (pDVar3->super_QArrayData).alloc;
      if (lVar13 <= newSize) {
        lVar13 = newSize;
      }
      if (((pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
           super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
        lVar13 = newSize;
      }
    }
  }
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar10 = (QRect *)QArrayData::allocate(&local_30,0x10,0x10,lVar13,KeepSize);
  pQVar11 = pQVar10;
  lVar13 = newSize;
  if (newSize == 0) {
    newSize = 0;
  }
  else {
    do {
      iVar5 = (t->y1).m_i;
      iVar6 = (t->x2).m_i;
      iVar7 = (t->y2).m_i;
      (pQVar11->x1).m_i = (t->x1).m_i;
      (pQVar11->y1).m_i = iVar5;
      (pQVar11->x2).m_i = iVar6;
      (pQVar11->y2).m_i = iVar7;
      lVar13 = lVar13 + -1;
      pQVar11 = pQVar11 + 1;
    } while (lVar13 != 0);
  }
  pQVar4 = &((this->d).d)->super_QArrayData;
  (this->d).d = (Data *)local_30;
  (this->d).ptr = pQVar10;
  (this->d).size = newSize;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,0x10,0x10);
    }
  }
LAB_004682ab:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}